

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O0

int __thiscall
ncnn::Gemm::forward(Gemm *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int *piVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  int k;
  float sum;
  float *ptrB;
  int j_2;
  float *ptrA;
  int B_hstep;
  int A_hstep;
  int out_hstep;
  int i_2;
  Mat *top_blob;
  Mat *C;
  int broadcast_type_C;
  float *ptrC;
  int N;
  int K;
  int M;
  int j_1;
  float *ptr_1;
  int i_1;
  int B0_hstep;
  Mat B;
  int j;
  float *ptr;
  int i;
  int A0_hstep;
  Mat A;
  size_t elemsize;
  Mat *B0;
  Mat *A0;
  Allocator *in_stack_fffffffffffff828;
  Allocator *in_stack_fffffffffffff830;
  value_type *pvVar5;
  size_t in_stack_fffffffffffff838;
  int iVar6;
  undefined4 in_stack_fffffffffffff840;
  int in_stack_fffffffffffff844;
  undefined8 in_stack_fffffffffffff848;
  int _w;
  undefined4 in_stack_fffffffffffff850;
  undefined4 in_stack_fffffffffffff854;
  int local_790;
  int local_78c;
  int local_788;
  bool local_771;
  int local_6c0;
  int local_6bc;
  int local_698;
  int local_678;
  const_reference local_658;
  const_reference local_650;
  const_reference local_648;
  int local_638;
  float local_634;
  int local_624;
  int local_608;
  float *local_5f0;
  int *local_5e8;
  size_t local_5e0;
  int local_5d8;
  Allocator *local_5d0;
  int local_5c8;
  int local_5c4;
  int local_5c0;
  int local_5bc;
  int local_5b8;
  size_t local_5b0;
  float *local_5a8;
  int *local_5a0;
  size_t local_598;
  int local_590;
  Allocator *local_588;
  int local_580;
  int local_57c;
  int local_578;
  int local_574;
  int local_570;
  size_t local_568;
  float *local_560;
  int *local_558;
  size_t local_550;
  int local_548;
  Allocator *local_540;
  int local_538;
  int local_534;
  int local_530;
  int local_52c;
  int local_528;
  size_t local_520;
  float *local_518;
  int *local_510;
  size_t local_508;
  int local_500;
  Allocator *local_4f8;
  int local_4f0;
  int local_4ec;
  int local_4e8;
  int local_4e4;
  int local_4e0;
  size_t local_4d8;
  int local_4cc;
  float *local_4c8;
  int local_4c0;
  int local_4bc;
  int local_4b8;
  int local_4b4;
  void *local_4b0;
  int local_4a8;
  int local_4a4;
  value_type local_4a0;
  int local_454;
  void *local_450;
  int local_444;
  int local_440;
  value_type local_430;
  size_t local_3e8;
  const_reference local_3e0;
  const_reference local_3d8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_3c8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_3c0;
  int local_3ac;
  value_type *local_3a8;
  value_type *local_3a0;
  float **local_398;
  float **local_388;
  float **local_378;
  float **local_368;
  value_type *local_358;
  value_type *local_348;
  int local_338;
  undefined4 local_334;
  const_reference local_330;
  const_reference local_328;
  const_reference local_320;
  int local_318;
  undefined4 local_314;
  const_reference local_310;
  const_reference local_308;
  const_reference local_300;
  reference local_2f8;
  int local_2ec;
  value_type *local_2e8;
  int local_2dc;
  value_type *local_2d8;
  long local_2d0;
  const_reference local_2c8;
  long local_2c0;
  const_reference local_2b8;
  float **local_2b0;
  float **local_2a8;
  float **local_2a0;
  float **local_298;
  undefined8 *local_290;
  const_reference local_288;
  float **local_280;
  const_reference local_278;
  float **local_270;
  const_reference local_268;
  float **local_260;
  const_reference local_258;
  float **local_250;
  undefined8 local_248;
  undefined8 local_240;
  undefined4 local_234;
  float **local_230;
  undefined8 local_228;
  undefined8 local_220;
  undefined4 local_214;
  float **local_210;
  undefined8 local_208;
  undefined8 local_200;
  undefined4 local_1f4;
  float **local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined4 local_1d4;
  float **local_1d0;
  value_type *local_1c8;
  value_type *local_1c0;
  long local_1b8;
  reference local_1b0;
  long local_1a8;
  reference local_1a0;
  const_reference local_190;
  const_reference local_180;
  int local_168;
  undefined4 local_164;
  value_type *local_160;
  int local_148;
  undefined4 local_144;
  value_type *local_140;
  int local_128;
  undefined4 local_124;
  float **local_120;
  int local_108;
  undefined4 local_104;
  float **local_100;
  int local_e8;
  undefined4 local_e4;
  float **local_e0;
  int local_c8;
  undefined4 local_c4;
  float **local_c0;
  float *local_b8;
  float *local_a8;
  float *local_98;
  float *local_88;
  void *local_78;
  void *local_68;
  reference local_48;
  int local_40;
  undefined4 local_3c;
  float **local_38;
  int local_30;
  undefined4 local_2c;
  float **local_28;
  int local_20;
  undefined4 local_1c;
  float **local_18;
  int local_10;
  undefined4 local_c;
  float **local_8;
  
  local_3c8 = in_RDX;
  local_3c0 = in_RSI;
  if (*(int *)(in_RDI + 0xe0) == 0) {
    local_648 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  }
  else {
    local_648 = (const_reference)(in_RDI + 0x118);
  }
  local_3d8 = local_648;
  if (*(int *)(in_RDI + 0xe4) == 0) {
    if (*(int *)(in_RDI + 0xe0) == 0) {
      local_658 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_3c0,1);
    }
    else {
      local_658 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_3c0,0);
    }
    local_650 = local_658;
  }
  else {
    local_650 = (const_reference)(in_RDI + 0x160);
  }
  local_3e0 = local_650;
  local_3e8 = local_3d8->elemsize;
  local_3a8 = &local_430;
  local_430.data = (void *)0x0;
  local_430.refcount = (int *)0x0;
  local_430.elemsize = 0;
  local_430.elempack = 0;
  local_430.allocator = (Allocator *)0x0;
  local_430.dims = 0;
  local_430.w = 0;
  local_430.h = 0;
  local_430.d = 0;
  local_430.c = 0;
  local_430.cstep._0_4_ = 0;
  iVar6 = (int)local_430.cstep;
  local_430.cstep._0_4_ = 0;
  if (*(int *)(in_RDI + 0xd8) == 0) {
    local_308 = &local_430;
    local_430.cstep._0_4_ = iVar6;
    if (local_308 != local_3d8) {
      if (local_3d8->refcount != (int *)0x0) {
        piVar1 = local_3d8->refcount;
        local_314 = 1;
        LOCK();
        local_318 = *piVar1;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      local_430.data = local_3d8->data;
      local_430.refcount = local_3d8->refcount;
      local_430.elemsize = local_3d8->elemsize;
      local_430.elempack = local_3d8->elempack;
      local_430.allocator = local_3d8->allocator;
      local_430.dims = local_3d8->dims;
      local_430.w = local_3d8->w;
      local_430.h = local_3d8->h;
      local_430.d = local_3d8->d;
      local_430.c = local_3d8->c;
      local_190 = local_308;
      local_430.cstep._0_4_ = (int)local_3d8->cstep;
    }
    local_310 = local_3d8;
    local_300 = local_308;
  }
  else {
    Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                (int)(in_stack_fffffffffffff838 >> 0x20),(int)in_stack_fffffffffffff838,
                (size_t)in_stack_fffffffffffff830,in_stack_fffffffffffff828);
    if (local_3d8->dims == 3) {
      local_678 = (int)local_3d8->cstep;
    }
    else {
      local_678 = local_3d8->w;
    }
    local_440 = local_678;
    for (local_444 = 0; local_444 < local_430.h; local_444 = local_444 + 1) {
      local_2dc = local_444;
      local_2d8 = &local_430;
      local_450 = (void *)((long)local_430.data +
                          (long)local_430.w * (long)local_444 * local_430.elemsize);
      for (local_454 = 0; local_454 < local_430.w; local_454 = local_454 + 1) {
        local_2b8 = local_3d8;
        local_2c0 = (long)(local_454 * local_678 + local_444);
        *(undefined4 *)((long)local_450 + (long)local_454 * 4) =
             *(undefined4 *)((long)local_3d8->data + local_2c0 * 4);
      }
    }
  }
  local_3a0 = &local_4a0;
  local_4a0.data = (void *)0x0;
  local_4a0.refcount = (int *)0x0;
  local_4a0.elemsize = 0;
  local_4a0.elempack = 0;
  local_4a0.allocator = (Allocator *)0x0;
  local_4a0.dims = 0;
  local_4a0.w = 0;
  local_4a0.h = 0;
  local_4a0.d = 0;
  local_4a0.c = 0;
  local_4a0.cstep._0_4_ = 0;
  iVar6 = (int)local_4a0.cstep;
  local_4a0.cstep._0_4_ = 0;
  if (*(int *)(in_RDI + 0xdc) == 0) {
    Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                (int)(in_stack_fffffffffffff838 >> 0x20),(int)in_stack_fffffffffffff838,
                (size_t)in_stack_fffffffffffff830,in_stack_fffffffffffff828);
    if (local_3e0->dims == 3) {
      local_698 = (int)local_3e0->cstep;
    }
    else {
      local_698 = local_3e0->w;
    }
    local_4a4 = local_698;
    for (local_4a8 = 0; local_4a8 < local_4a0.h; local_4a8 = local_4a8 + 1) {
      local_2ec = local_4a8;
      local_2e8 = &local_4a0;
      local_4b0 = (void *)((long)local_4a0.data +
                          (long)local_4a0.w * (long)local_4a8 * local_4a0.elemsize);
      for (local_4b4 = 0; local_4b4 < local_4a0.w; local_4b4 = local_4b4 + 1) {
        local_2c8 = local_3e0;
        local_2d0 = (long)(local_4b4 * local_698 + local_4a8);
        *(undefined4 *)((long)local_4b0 + (long)local_4b4 * 4) =
             *(undefined4 *)((long)local_3e0->data + local_2d0 * 4);
      }
    }
  }
  else {
    local_328 = &local_4a0;
    local_4a0.cstep._0_4_ = iVar6;
    if (local_328 != local_3e0) {
      if (local_3e0->refcount != (int *)0x0) {
        piVar1 = local_3e0->refcount;
        local_334 = 1;
        LOCK();
        local_338 = *piVar1;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      local_4a0.data = local_3e0->data;
      local_4a0.refcount = local_3e0->refcount;
      local_4a0.elemsize = local_3e0->elemsize;
      local_4a0.elempack = local_3e0->elempack;
      local_4a0.allocator = local_3e0->allocator;
      local_4a0.dims = local_3e0->dims;
      local_4a0.w = local_3e0->w;
      local_4a0.h = local_3e0->h;
      local_4a0.d = local_3e0->d;
      local_4a0.c = local_3e0->c;
      local_180 = local_328;
      local_4a0.cstep._0_4_ = (int)local_3e0->cstep;
    }
    local_330 = local_3e0;
    local_320 = local_328;
  }
  if (local_430.dims == 3) {
    local_6bc = local_430.c;
  }
  else {
    local_6bc = local_430.h;
  }
  local_4b8 = local_6bc;
  local_4bc = local_430.w;
  if (local_4a0.dims == 3) {
    local_6c0 = local_4a0.c;
  }
  else {
    local_6c0 = local_4a0.h;
  }
  local_4c0 = local_6c0;
  local_4c8 = (float *)0x0;
  local_4cc = 0;
  if (*(int *)(in_RDI + 0xe8) == 0) {
    if ((*(int *)(in_RDI + 0xe0) == 0) || (*(int *)(in_RDI + 0xe4) == 0)) {
      if (*(int *)(in_RDI + 0xe0) == 0) {
        if (*(int *)(in_RDI + 0xe4) == 0) {
          sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_3c0);
          if (sVar2 == 3) {
            local_258 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_3c0,2);
            local_250 = &local_5f0;
            local_5f0 = (float *)local_258->data;
            local_5e8 = local_258->refcount;
            local_5e0 = local_258->elemsize;
            local_5d8 = local_258->elempack;
            local_5d0 = local_258->allocator;
            local_5c8 = local_258->dims;
            local_5c4 = local_258->w;
            local_5c0 = local_258->h;
            local_5bc = local_258->d;
            local_5b8 = local_258->c;
            local_5b0 = local_258->cstep;
            local_38 = local_250;
            if (local_5e8 != (int *)0x0) {
              local_3c = 1;
              LOCK();
              local_40 = *local_5e8;
              *local_5e8 = *local_5e8 + 1;
              UNLOCK();
            }
          }
          else {
            local_1d0 = &local_5f0;
            local_1d4 = 0;
            local_1e0 = 4;
            local_1e8 = 0;
            local_5f0 = (float *)0x0;
            local_5e8 = (int *)0x0;
            local_5e0 = 0;
            local_5d8 = 0;
            local_5d0 = (Allocator *)0x0;
            local_5c8 = 0;
            local_5c4 = 0;
            local_5c0 = 0;
            local_5bc = 0;
            local_5b8 = 0;
            local_5b0 = 0;
            Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                        (int)(in_stack_fffffffffffff838 >> 0x20),(size_t)in_stack_fffffffffffff830,
                        in_stack_fffffffffffff828);
          }
          local_2b0 = &local_5f0;
          local_4c8 = local_5f0;
          local_368 = &local_5f0;
          local_120 = local_368;
          if (local_5e8 != (int *)0x0) {
            local_124 = 0xffffffff;
            LOCK();
            local_128 = *local_5e8;
            *local_5e8 = *local_5e8 + -1;
            UNLOCK();
            if (local_128 == 1) {
              if (local_5d0 == (Allocator *)0x0) {
                local_88 = local_5f0;
                if (local_5f0 != (float *)0x0) {
                  free(local_5f0);
                }
              }
              else {
                (*local_5d0->_vptr_Allocator[3])(local_5d0,local_5f0);
              }
            }
          }
          local_5f0 = (float *)0x0;
          local_5e0 = 0;
          local_5d8 = 0;
          local_5c8 = 0;
          local_5c4 = 0;
          local_5c0 = 0;
          local_5bc = 0;
          local_5b8 = 0;
          local_5b0 = 0;
          local_5e8 = (int *)0x0;
        }
        else {
          sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_3c0);
          if (sVar2 == 2) {
            local_268 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_3c0,1);
            local_260 = &local_5a8;
            local_5a8 = (float *)local_268->data;
            local_5a0 = local_268->refcount;
            local_598 = local_268->elemsize;
            local_590 = local_268->elempack;
            local_588 = local_268->allocator;
            local_580 = local_268->dims;
            local_57c = local_268->w;
            local_578 = local_268->h;
            local_574 = local_268->d;
            local_570 = local_268->c;
            local_568 = local_268->cstep;
            local_28 = local_260;
            if (local_5a0 != (int *)0x0) {
              local_2c = 1;
              LOCK();
              local_30 = *local_5a0;
              *local_5a0 = *local_5a0 + 1;
              UNLOCK();
            }
          }
          else {
            local_1f0 = &local_5a8;
            local_1f4 = 0;
            local_200 = 4;
            local_208 = 0;
            local_5a8 = (float *)0x0;
            local_5a0 = (int *)0x0;
            local_598 = 0;
            local_590 = 0;
            local_588 = (Allocator *)0x0;
            local_580 = 0;
            local_57c = 0;
            local_578 = 0;
            local_574 = 0;
            local_570 = 0;
            local_568 = 0;
            Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                        (int)(in_stack_fffffffffffff838 >> 0x20),(size_t)in_stack_fffffffffffff830,
                        in_stack_fffffffffffff828);
          }
          local_2a8 = &local_5a8;
          local_4c8 = local_5a8;
          local_378 = &local_5a8;
          local_100 = local_378;
          if (local_5a0 != (int *)0x0) {
            local_104 = 0xffffffff;
            LOCK();
            local_108 = *local_5a0;
            *local_5a0 = *local_5a0 + -1;
            UNLOCK();
            if (local_108 == 1) {
              if (local_588 == (Allocator *)0x0) {
                local_98 = local_5a8;
                if (local_5a8 != (float *)0x0) {
                  free(local_5a8);
                }
              }
              else {
                (*local_588->_vptr_Allocator[3])(local_588,local_5a8);
              }
            }
          }
          local_5a8 = (float *)0x0;
          local_598 = 0;
          local_590 = 0;
          local_580 = 0;
          local_57c = 0;
          local_578 = 0;
          local_574 = 0;
          local_570 = 0;
          local_568 = 0;
          local_5a0 = (int *)0x0;
        }
      }
      else {
        sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_3c0);
        if (sVar2 == 2) {
          local_278 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_3c0,1);
          local_270 = &local_560;
          local_560 = (float *)local_278->data;
          local_558 = local_278->refcount;
          local_550 = local_278->elemsize;
          local_548 = local_278->elempack;
          local_540 = local_278->allocator;
          local_538 = local_278->dims;
          local_534 = local_278->w;
          local_530 = local_278->h;
          local_52c = local_278->d;
          local_528 = local_278->c;
          local_520 = local_278->cstep;
          local_18 = local_270;
          if (local_558 != (int *)0x0) {
            local_1c = 1;
            LOCK();
            local_20 = *local_558;
            *local_558 = *local_558 + 1;
            UNLOCK();
          }
        }
        else {
          local_210 = &local_560;
          local_214 = 0;
          local_220 = 4;
          local_228 = 0;
          local_560 = (float *)0x0;
          local_558 = (int *)0x0;
          local_550 = 0;
          local_548 = 0;
          local_540 = (Allocator *)0x0;
          local_538 = 0;
          local_534 = 0;
          local_530 = 0;
          local_52c = 0;
          local_528 = 0;
          local_520 = 0;
          Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                      (int)(in_stack_fffffffffffff838 >> 0x20),(size_t)in_stack_fffffffffffff830,
                      in_stack_fffffffffffff828);
        }
        local_2a0 = &local_560;
        local_4c8 = local_560;
        local_388 = &local_560;
        local_e0 = local_388;
        if (local_558 != (int *)0x0) {
          local_e4 = 0xffffffff;
          LOCK();
          local_e8 = *local_558;
          *local_558 = *local_558 + -1;
          UNLOCK();
          if (local_e8 == 1) {
            if (local_540 == (Allocator *)0x0) {
              local_a8 = local_560;
              if (local_560 != (float *)0x0) {
                free(local_560);
              }
            }
            else {
              (*local_540->_vptr_Allocator[3])(local_540,local_560);
            }
          }
        }
        local_560 = (float *)0x0;
        local_550 = 0;
        local_548 = 0;
        local_538 = 0;
        local_534 = 0;
        local_530 = 0;
        local_52c = 0;
        local_528 = 0;
        local_520 = 0;
        local_558 = (int *)0x0;
      }
    }
    else {
      sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_3c0);
      if (sVar2 == 1) {
        local_288 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_3c0,0);
        local_280 = &local_518;
        local_518 = (float *)local_288->data;
        local_510 = local_288->refcount;
        local_508 = local_288->elemsize;
        local_500 = local_288->elempack;
        local_4f8 = local_288->allocator;
        local_4f0 = local_288->dims;
        local_4ec = local_288->w;
        local_4e8 = local_288->h;
        local_4e4 = local_288->d;
        local_4e0 = local_288->c;
        local_4d8 = local_288->cstep;
        local_8 = local_280;
        if (local_510 != (int *)0x0) {
          local_c = 1;
          LOCK();
          local_10 = *local_510;
          *local_510 = *local_510 + 1;
          UNLOCK();
        }
      }
      else {
        local_230 = &local_518;
        local_234 = 0;
        local_240 = 4;
        local_248 = 0;
        local_518 = (float *)0x0;
        local_510 = (int *)0x0;
        local_508 = 0;
        local_500 = 0;
        local_4f8 = (Allocator *)0x0;
        local_4f0 = 0;
        local_4ec = 0;
        local_4e8 = 0;
        local_4e4 = 0;
        local_4e0 = 0;
        local_4d8 = 0;
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                    (int)(in_stack_fffffffffffff838 >> 0x20),(size_t)in_stack_fffffffffffff830,
                    in_stack_fffffffffffff828);
      }
      local_298 = &local_518;
      local_4c8 = local_518;
      local_398 = &local_518;
      local_c0 = local_398;
      if (local_510 != (int *)0x0) {
        local_c4 = 0xffffffff;
        LOCK();
        local_c8 = *local_510;
        *local_510 = *local_510 + -1;
        UNLOCK();
        if (local_c8 == 1) {
          if (local_4f8 == (Allocator *)0x0) {
            local_b8 = local_518;
            if (local_518 != (float *)0x0) {
              free(local_518);
            }
          }
          else {
            (*local_4f8->_vptr_Allocator[3])(local_4f8,local_518);
          }
        }
      }
      local_518 = (float *)0x0;
      local_508 = 0;
      local_500 = 0;
      local_4f0 = 0;
      local_4ec = 0;
      local_4e8 = 0;
      local_4e4 = 0;
      local_4e0 = 0;
      local_4d8 = 0;
      local_510 = (int *)0x0;
    }
    if (local_4c8 != (float *)0x0) {
      sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_3c0);
      pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_3c0,sVar2 - 1);
      if ((pvVar3->dims == 1) && (pvVar3->w == 1)) {
        local_4cc = 0;
      }
      if ((pvVar3->dims == 1) && (pvVar3->w == local_4b8)) {
        local_4cc = 1;
      }
      if ((pvVar3->dims == 1) && (pvVar3->w == local_4c0)) {
        local_4cc = 4;
      }
      if (((pvVar3->dims == 2) && (pvVar3->w == 1)) && (pvVar3->h == local_4b8)) {
        local_4cc = 2;
      }
      if (((pvVar3->dims == 2) && (pvVar3->w == local_4c0)) && (pvVar3->h == local_4b8)) {
        local_4cc = 3;
      }
      if (((pvVar3->dims == 2) && (pvVar3->w == local_4c0)) && (pvVar3->h == 1)) {
        local_4cc = 4;
      }
    }
  }
  else {
    local_290 = (undefined8 *)(in_RDI + 0x1a8);
    local_4c8 = (float *)*local_290;
    local_4cc = *(int *)(in_RDI + 0xf8);
  }
  pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_3c8,0);
  _w = (int)((ulong)in_stack_fffffffffffff848 >> 0x20);
  iVar6 = (int)(in_stack_fffffffffffff838 >> 0x20);
  if (*(int *)(in_RDI + 0x108) == 0) {
    if (*(int *)(in_RDI + 0xfc) == 0) {
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),iVar6,
                  (int)in_stack_fffffffffffff838,(size_t)in_stack_fffffffffffff830,
                  in_stack_fffffffffffff828);
    }
    else {
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),_w,
                  (int)in_stack_fffffffffffff848,in_stack_fffffffffffff844,in_stack_fffffffffffff838
                  ,in_stack_fffffffffffff830);
    }
  }
  else if (*(int *)(in_RDI + 0xfc) == 0) {
    Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),iVar6,
                (int)in_stack_fffffffffffff838,(size_t)in_stack_fffffffffffff830,
                in_stack_fffffffffffff828);
  }
  else {
    Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),_w,
                (int)in_stack_fffffffffffff848,in_stack_fffffffffffff844,in_stack_fffffffffffff838,
                in_stack_fffffffffffff830);
  }
  local_771 = true;
  if (pvVar4->data != (void *)0x0) {
    local_771 = pvVar4->cstep * (long)pvVar4->c == 0;
    local_48 = pvVar4;
  }
  if (local_771) {
    local_3ac = -100;
  }
  else {
    for (local_608 = 0; local_608 < local_4b8; local_608 = local_608 + 1) {
      if (pvVar4->dims == 3) {
        local_788 = (int)pvVar4->cstep;
      }
      else {
        local_788 = pvVar4->w;
      }
      if (local_430.dims == 3) {
        local_78c = (int)local_430.cstep;
      }
      else {
        local_78c = local_430.w;
      }
      if (local_4a0.dims == 3) {
        local_790 = (int)local_4a0.cstep;
      }
      else {
        local_790 = local_4a0.w;
      }
      local_1c0 = &local_430;
      for (local_624 = 0; local_624 < local_4c0; local_624 = local_624 + 1) {
        local_1c8 = &local_4a0;
        local_634 = 0.0;
        if (local_4c8 != (float *)0x0) {
          if (local_4cc == 0) {
            local_634 = *local_4c8;
          }
          if (local_4cc == 1) {
            local_634 = local_4c8[local_608];
          }
          if (local_4cc == 2) {
            local_634 = local_4c8[local_608];
          }
          if (local_4cc == 3) {
            local_634 = local_4c8[local_608 * local_4c0 + local_624];
          }
          if (local_4cc == 4) {
            local_634 = local_4c8[local_624];
          }
          local_634 = *(float *)(in_RDI + 0xd4) * local_634;
        }
        for (local_638 = 0; local_638 < local_4bc; local_638 = local_638 + 1) {
          local_634 = *(float *)((long)local_430.data +
                                (long)local_638 * 4 + (long)(local_608 * local_78c) * 4) *
                      *(float *)((long)local_4a0.data +
                                (long)local_638 * 4 + (long)(local_624 * local_790) * 4) + local_634
          ;
        }
        local_634 = *(float *)(in_RDI + 0xd0) * local_634;
        if (*(int *)(in_RDI + 0x108) == 0) {
          local_1b8 = (long)(local_608 * local_788 + local_624);
          *(float *)((long)pvVar4->data + local_1b8 * 4) = local_634;
          local_1b0 = pvVar4;
        }
        else {
          local_1a8 = (long)(local_624 * local_788 + local_608);
          *(float *)((long)pvVar4->data + local_1a8 * 4) = local_634;
          local_1a0 = pvVar4;
        }
      }
    }
    local_3ac = 0;
  }
  pvVar5 = &local_4a0;
  local_358 = pvVar5;
  local_2f8 = pvVar4;
  local_140 = pvVar5;
  if (local_4a0.refcount != (int *)0x0) {
    local_144 = 0xffffffff;
    LOCK();
    local_148 = *local_4a0.refcount;
    *local_4a0.refcount = *local_4a0.refcount + -1;
    UNLOCK();
    if (local_148 == 1) {
      if (local_4a0.allocator == (Allocator *)0x0) {
        local_78 = local_4a0.data;
        if (local_4a0.data != (void *)0x0) {
          free(local_4a0.data);
        }
      }
      else {
        (*(local_4a0.allocator)->_vptr_Allocator[3])(local_4a0.allocator,local_4a0.data);
      }
    }
  }
  pvVar5->data = (void *)0x0;
  pvVar5->elemsize = 0;
  pvVar5->elempack = 0;
  pvVar5->dims = 0;
  pvVar5->w = 0;
  pvVar5->h = 0;
  pvVar5->d = 0;
  pvVar5->c = 0;
  pvVar5->cstep = 0;
  pvVar5->refcount = (int *)0x0;
  pvVar5 = &local_430;
  if (local_430.refcount != (int *)0x0) {
    local_164 = 0xffffffff;
    LOCK();
    local_168 = *local_430.refcount;
    *local_430.refcount = *local_430.refcount + -1;
    UNLOCK();
    if (local_168 == 1) {
      local_348 = pvVar5;
      local_160 = pvVar5;
      if (local_430.allocator == (Allocator *)0x0) {
        local_68 = local_430.data;
        if (local_430.data != (void *)0x0) {
          free(local_430.data);
        }
      }
      else {
        (*(local_430.allocator)->_vptr_Allocator[3])(local_430.allocator,local_430.data);
      }
    }
  }
  pvVar5->data = (void *)0x0;
  pvVar5->elemsize = 0;
  pvVar5->elempack = 0;
  pvVar5->dims = 0;
  pvVar5->w = 0;
  pvVar5->h = 0;
  pvVar5->d = 0;
  pvVar5->c = 0;
  pvVar5->cstep = 0;
  pvVar5->refcount = (int *)0x0;
  return local_3ac;
}

Assistant:

int Gemm::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& A0 = constantA ? A_data : bottom_blobs[0];
    const Mat& B0 = constantB ? B_data : constantA ? bottom_blobs[0] : bottom_blobs[1];

    size_t elemsize = A0.elemsize;

    Mat A;
    if (transA == 0)
    {
        A = A0;
    }
    else
    {
        // transpose A to row-major
        A.create((A0.dims == 3 ? A0.c : A0.h), A0.w, elemsize, opt.workspace_allocator);

        const int A0_hstep = A0.dims == 3 ? (int)A0.cstep : A0.w;

        for (int i = 0; i < A.h; i++)
        {
            float* ptr = A.row(i);
            for (int j = 0; j < A.w; j++)
            {
                ptr[j] = A0[j * A0_hstep + i];
            }
        }
    }

    Mat B;
    if (transB == 0)
    {
        // transpose B to col-major
        B.create((B0.dims == 3 ? B0.c : B0.h), B0.w, elemsize, opt.workspace_allocator);

        const int B0_hstep = B0.dims == 3 ? (int)B0.cstep : B0.w;

        for (int i = 0; i < B.h; i++)
        {
            float* ptr = B.row(i);
            for (int j = 0; j < B.w; j++)
            {
                ptr[j] = B0[j * B0_hstep + i];
            }
        }
    }
    else
    {
        B = B0;
    }

    const int M = A.dims == 3 ? A.c : A.h;
    const int K = A.w; // assert A.w == B.w
    const int N = B.dims == 3 ? B.c : B.h;

    const float* ptrC = 0;
    int broadcast_type_C = 0;
    if (constantC)
    {
        ptrC = C_data;
        broadcast_type_C = constant_broadcast_type_C;
    }
    else
    {
        if (constantA && constantB)
        {
            ptrC = bottom_blobs.size() == 1 ? bottom_blobs[0] : 0;
        }
        else if (constantA)
        {
            ptrC = bottom_blobs.size() == 2 ? bottom_blobs[1] : 0;
        }
        else if (constantB)
        {
            ptrC = bottom_blobs.size() == 2 ? bottom_blobs[1] : 0;
        }
        else
        {
            ptrC = bottom_blobs.size() == 3 ? bottom_blobs[2] : 0;
        }

        if (ptrC)
        {
            const Mat& C = bottom_blobs[bottom_blobs.size() - 1];

            if (C.dims == 1 && C.w == 1)
            {
                // scalar
                broadcast_type_C = 0;
            }
            if (C.dims == 1 && C.w == M)
            {
                // M
                // auto broadcast from h to w is the ncnn-style convention
                broadcast_type_C = 1;
            }
            if (C.dims == 1 && C.w == N)
            {
                // N
                broadcast_type_C = 4;
            }
            if (C.dims == 2 && C.w == 1 && C.h == M)
            {
                // Mx1
                broadcast_type_C = 2;
            }
            if (C.dims == 2 && C.w == N && C.h == M)
            {
                // MxN
                broadcast_type_C = 3;
            }
            if (C.dims == 2 && C.w == N && C.h == 1)
            {
                // 1xN
                broadcast_type_C = 4;
            }
        }
    }

    Mat& top_blob = top_blobs[0];
    if (output_transpose)
    {
        if (output_N1M)
            top_blob.create(M, 1, N, elemsize, opt.blob_allocator);
        else
            top_blob.create(M, N, elemsize, opt.blob_allocator);
    }
    else
    {
        if (output_N1M)
            top_blob.create(N, 1, M, elemsize, opt.blob_allocator);
        else
            top_blob.create(N, M, elemsize, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < M; i++)
    {
        const int out_hstep = top_blob.dims == 3 ? (int)top_blob.cstep : top_blob.w;

        const int A_hstep = A.dims == 3 ? (int)A.cstep : A.w;
        const int B_hstep = B.dims == 3 ? (int)B.cstep : B.w;

        const float* ptrA = (const float*)A + i * A_hstep;

        for (int j = 0; j < N; j++)
        {
            const float* ptrB = (const float*)B + j * B_hstep;

            float sum = 0.f;
            if (ptrC)
            {
                if (broadcast_type_C == 0)
                {
                    sum = ptrC[0];
                }
                if (broadcast_type_C == 1)
                {
                    sum = ptrC[i];
                }
                if (broadcast_type_C == 2)
                {
                    sum = ptrC[i];
                }
                if (broadcast_type_C == 3)
                {
                    sum = ptrC[i * N + j];
                }
                if (broadcast_type_C == 4)
                {
                    sum = ptrC[j];
                }

                sum *= beta;
            }

            for (int k = 0; k < K; k++)
            {
                sum += ptrA[k] * ptrB[k];
            }

            sum *= alpha;

            if (output_transpose)
            {
                top_blob[j * out_hstep + i] = sum;
            }
            else
            {
                top_blob[i * out_hstep + j] = sum;
            }
        }
    }

    return 0;
}